

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_41304e::SeedHardwareFast(CSHA512 *hasher)

{
  long in_FS_OFFSET;
  uint64_t out;
  size_t len;
  
  len = *(size_t *)(in_FS_OFFSET + 0x28);
  if (((anonymous_namespace)::g_rdrand_supported & 1) != 0) {
    GetRdRand();
    CSHA512::Write((CSHA512 *)out,(uchar *)hasher,len);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == len) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedHardwareFast(CSHA512& hasher) noexcept {
#if defined(__x86_64__) || defined(__amd64__) || defined(__i386__)
    if (g_rdrand_supported) {
        uint64_t out = GetRdRand();
        hasher.Write((const unsigned char*)&out, sizeof(out));
        return;
    }
#elif defined(__aarch64__) && defined(HWCAP2_RNG)
    if (g_rndr_supported) {
        uint64_t out = GetRNDR();
        hasher.Write((const unsigned char*)&out, sizeof(out));
        return;
    }
#endif
}